

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ClassMethodDeclarationSyntax::setChild
          (ClassMethodDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  TokenList *in_stack_ffffffffffffffb8;
  TokenList *in_stack_ffffffffffffffc0;
  FunctionDeclarationSyntax *local_20;
  not_null<slang::syntax::FunctionDeclarationSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1fc0ec);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffffc0,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_ffffffffffffffb8);
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1fc114);
    SyntaxNode::as<slang::syntax::TokenList>(pSVar1);
    TokenList::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1fc139);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_20 = (FunctionDeclarationSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1fc149);
      local_20 = SyntaxNode::as<slang::syntax::FunctionDeclarationSyntax>(pSVar1);
    }
    not_null<slang::syntax::FunctionDeclarationSyntax_*>::
    not_null<slang::syntax::FunctionDeclarationSyntax_*>(local_18,&local_20);
    *(FunctionDeclarationSyntax **)(in_RDI + 0x88) = local_18[0].ptr;
  }
  return;
}

Assistant:

void ClassMethodDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: qualifiers = child.node()->as<TokenList>(); return;
        case 2: declaration = child.node() ? &child.node()->as<FunctionDeclarationSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}